

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memrev.c
# Opt level: O1

int mpt_memswap(void *from,void *to,size_t len)

{
  int iVar1;
  ulong uVar2;
  ulong __n;
  char buf [1024];
  undefined1 auStack_438 [1032];
  
  iVar1 = -1;
  if (to != (void *)0x0 && from != (void *)0x0) {
    __n = (ulong)((uint)len & 0x3ff);
    if (0x3ff < len) {
      uVar2 = len >> 10;
      do {
        memcpy(auStack_438,from,0x400);
        memcpy(from,to,0x400);
        memcpy(to,auStack_438,0x400);
        from = (void *)((long)from + 0x400);
        to = (void *)((long)to + 0x400);
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    iVar1 = 0;
    if (__n != 0) {
      memcpy(auStack_438,from,__n);
      memcpy(from,to,__n);
      memcpy(to,auStack_438,__n);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

extern int mpt_memswap(void *from, void *to, size_t len)
{
	char buf[1024];
	size_t parts, i;
	
	if (!from || !to) {
		return MPT_ERROR(BadArgument);
	}
	
	parts = len / sizeof(buf);
	len   = len % sizeof(buf);
	
	for ( i = 0 ; i < parts ; i++ ) {
		(void) memcpy(buf, from, sizeof(buf));
		(void) memcpy(from, to, sizeof(buf));
		(void) memcpy(to, buf, sizeof(buf));
		
		from = ((char *) from) + sizeof(buf);
		to   = ((char *) to)   + sizeof(buf);
	}
	if ( len ) {
		(void) memcpy(buf, from, len);
		(void) memcpy(from, to, len);
		(void) memcpy(to, buf, len);
	}
	return 0;
}